

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

bool sptk::SnPrintf<sptk::int24_t>
               (int24_t *data,string *print_format,size_t buffer_size,char *buffer)

{
  char *__format;
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = false;
  if (((buffer != (char *)0x0) && (buffer_size != 0)) &&
     (bVar3 = false, print_format->_M_string_length != 0)) {
    __format = (print_format->_M_dataplus)._M_p;
    uVar1 = int24_t::operator_cast_to_int(data);
    iVar2 = snprintf(buffer,buffer_size,__format,(ulong)uVar1);
    bVar3 = -1 < iVar2;
  }
  return bVar3;
}

Assistant:

bool SnPrintf(int24_t data, const std::string& print_format,
              std::size_t buffer_size, char* buffer) {
  if (print_format.empty() || 0 == buffer_size || NULL == buffer) {
    return false;
  }

  return (std::snprintf(buffer, buffer_size, print_format.c_str(),
                        static_cast<int>(data)) < 0)
             ? false
             : true;
}